

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

void Dar_LibSetup(Dar_Lib_t *p,Vec_Int_t *vOuts,Vec_Int_t *vPrios)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  size_t __size;
  long lVar10;
  
  if (p->iObj != p->nObjs) {
    __assert_fail("p->iObj == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x121,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (lVar5 = -0x378; lVar5 != 0; lVar5 = lVar5 + 4) {
    *(undefined4 *)((long)p->pNodes + lVar5) = 0;
    *(undefined4 *)((long)p->pSubgr + lVar5) = 0;
  }
  for (iVar9 = 0; iVar9 < vOuts->nSize; iVar9 = iVar9 + 1) {
    iVar3 = Vec_IntEntry(vOuts,iVar9);
    uVar6 = (ulong)p->pObjs[iVar3] >> 0x24;
    uVar4 = SUB84(p->pObjs[iVar3],4) >> 4;
    uVar8 = ~uVar4 & 0xffff;
    if (uVar8 < uVar4) {
      uVar6 = (ulong)uVar8;
    }
    p->nSubgr[p->pMap[uVar6]] = p->nSubgr[p->pMap[uVar6]] + 1;
  }
  __size = (long)vOuts->nSize << 2;
  piVar7 = (int *)malloc(__size);
  p->pSubgrMem = piVar7;
  piVar7 = (int *)malloc(__size);
  p->pSubgr0Mem = piVar7;
  p->nSubgrTotal = 0;
  for (lVar5 = 0; lVar5 != 0xde; lVar5 = lVar5 + 1) {
    iVar9 = p->nSubgrTotal;
    p->pSubgr[lVar5] = p->pSubgrMem + iVar9;
    p->pSubgr0[lVar5] = p->pSubgr0Mem + iVar9;
    p->nSubgrTotal = p->nSubgr[lVar5] + iVar9;
    p->nSubgr[lVar5] = 0;
  }
  iVar9 = p->nSubgrTotal;
  if (iVar9 != vOuts->nSize) {
    __assert_fail("p->nSubgrTotal == Vec_IntSize(vOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x138,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (iVar3 = 0; iVar3 < iVar9; iVar3 = iVar3 + 1) {
    iVar9 = Vec_IntEntry(vOuts,iVar3);
    uVar6 = (ulong)p->pObjs[iVar9] >> 0x24;
    uVar4 = SUB84(p->pObjs[iVar9],4) >> 4;
    uVar8 = ~uVar4 & 0xffff;
    if (uVar8 < uVar4) {
      uVar6 = (ulong)uVar8;
    }
    bVar1 = p->pMap[uVar6];
    piVar7 = p->pSubgr[bVar1];
    iVar2 = p->nSubgr[bVar1];
    p->nSubgr[bVar1] = iVar2 + 1;
    piVar7[iVar2] = iVar9;
    iVar9 = vOuts->nSize;
  }
  piVar7 = (int *)malloc((long)iVar9 << 2);
  p->pPriosMem = piVar7;
  p->nSubgrTotal = 0;
  iVar9 = 0;
  for (lVar5 = 0; lVar5 != 0xde; lVar5 = lVar5 + 1) {
    iVar3 = p->nSubgrTotal;
    p->pPrios[lVar5] = p->pPriosMem + iVar3;
    p->nSubgrTotal = p->nSubgr[lVar5] + iVar3;
    for (lVar10 = 0; lVar10 < p->nSubgr[lVar5]; lVar10 = lVar10 + 1) {
      iVar3 = Vec_IntEntry(vPrios,iVar9 + (int)lVar10);
      p->pPrios[lVar5][lVar10] = iVar3;
    }
    iVar9 = iVar9 + (int)lVar10;
  }
  if (p->nSubgrTotal != vOuts->nSize) {
    __assert_fail("p->nSubgrTotal == Vec_IntSize(vOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x179,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (iVar9 != vPrios->nSize) {
    __assert_fail("Counter == Vec_IntSize(vPrios)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x17a,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (lVar5 = 0; lVar5 < p->iObj; lVar5 = lVar5 + 1) {
    p->pObjs[lVar5] = (Dar_LibObj_t)((ulong)p->pObjs[lVar5] & 0xfffffffff | 0xff000000000);
  }
  for (lVar5 = 0; lVar5 != 0xde; lVar5 = lVar5 + 1) {
    for (lVar10 = 0; lVar10 < p->nSubgr[lVar5]; lVar10 = lVar10 + 1) {
      Dar_LibSetup_rec(p,p->pObjs + p->pSubgr[lVar5][lVar10],(int)lVar5,0);
    }
  }
  p->nNodesTotal = 0;
  iVar9 = 0;
  for (lVar5 = 0x7dc; lVar5 != 0x8ba; lVar5 = lVar5 + 1) {
    iVar9 = iVar9 + p->nSubgr[lVar5 + -4];
    p->nNodesTotal = iVar9;
  }
  piVar7 = (int *)malloc((long)iVar9 << 2);
  p->pNodesMem = piVar7;
  piVar7 = (int *)malloc((long)iVar9 << 2);
  p->pNodes0Mem = piVar7;
  p->nNodesTotal = 0;
  for (lVar5 = 0x7dc; lVar5 != 0x8ba; lVar5 = lVar5 + 1) {
    iVar9 = p->nNodesTotal;
    *(int **)((long)p + lVar5 * 8 + -0x1bf8) = p->pNodesMem + iVar9;
    *(int **)((long)p + lVar5 * 8 + -0x1178) = p->pNodes0Mem + iVar9;
    p->nNodesTotal = p->nSubgr[lVar5 + -4] + iVar9;
    p->nSubgr[lVar5 + -4] = 0;
  }
  for (lVar5 = 0; lVar5 < p->iObj; lVar5 = lVar5 + 1) {
    p->pObjs[lVar5] = (Dar_LibObj_t)((ulong)p->pObjs[lVar5] & 0xfffffffff | 0xff000000000);
  }
  iVar9 = 0;
  for (lVar5 = 0; lVar5 != 0xde; lVar5 = lVar5 + 1) {
    for (lVar10 = 0; lVar10 < p->nSubgr[lVar5]; lVar10 = lVar10 + 1) {
      Dar_LibSetup_rec(p,p->pObjs + p->pSubgr[lVar5][lVar10],(int)lVar5,1);
    }
    iVar9 = iVar9 + p->nNodes[lVar5];
  }
  if (iVar9 == p->nNodesTotal) {
    lVar5 = 0;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      p->pObjs[lVar10] = (Dar_LibObj_t)(((ulong)p->pObjs[lVar10] & 0xfffffffff) + lVar5);
      lVar5 = lVar5 + 0x1000000000;
    }
    return;
  }
  __assert_fail("nNodesTotal == p->nNodesTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                ,0x19f,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Dar_LibSetup( Dar_Lib_t * p, Vec_Int_t * vOuts, Vec_Int_t * vPrios )
{
    int fTraining = 0;
    Dar_LibObj_t * pObj;
    int nNodesTotal, uTruth, Class, Out, i, k;
    assert( p->iObj == p->nObjs );

    // count the number of representatives of each class
    for ( i = 0; i < 222; i++ )
        p->nSubgr[i] = p->nNodes[i] = 0;
    Vec_IntForEachEntry( vOuts, Out, i )
    {
        pObj = Dar_LibObj( p, Out );
        uTruth = Dar_LibObjTruth( pObj );
        Class = p->pMap[uTruth];
        p->nSubgr[Class]++;
    }
    // allocate memory for the roots of each class
    p->pSubgrMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
    p->pSubgr0Mem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
    p->nSubgrTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
        p->pSubgr[i] = p->pSubgrMem + p->nSubgrTotal;
        p->pSubgr0[i] = p->pSubgr0Mem + p->nSubgrTotal;
        p->nSubgrTotal += p->nSubgr[i];
        p->nSubgr[i] = 0;
    }
    assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
    // add the outputs to storage
    Vec_IntForEachEntry( vOuts, Out, i )
    {
        pObj = Dar_LibObj( p, Out );
        uTruth = Dar_LibObjTruth( pObj );
        Class = p->pMap[uTruth];
        p->pSubgr[Class][ p->nSubgr[Class]++ ] = Out;
    }

    if ( fTraining )
    {
        // allocate memory for the priority of roots of each class
        p->pPriosMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPrios[i] = p->pPriosMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPrios[i][k] = k;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );

        // allocate memory for the priority of roots of each class
        p->pPlaceMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPlace[i] = p->pPlaceMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPlace[i][k] = k;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );

        // allocate memory for the priority of roots of each class
        p->pScoreMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pScore[i] = p->pScoreMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pScore[i][k] = 0;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
    }
    else
    {
        int Counter = 0;
        // allocate memory for the priority of roots of each class
        p->pPriosMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPrios[i] = p->pPriosMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPrios[i][k] = Vec_IntEntry(vPrios, Counter++);

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
        assert( Counter == Vec_IntSize(vPrios) );
    }

    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // count nodes in each class
    for ( i = 0; i < 222; i++ )
        for ( k = 0; k < p->nSubgr[i]; k++ )
            Dar_LibSetup_rec( p, Dar_LibObj(p, p->pSubgr[i][k]), i, 0 );
    // count the total number of nodes
    p->nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
        p->nNodesTotal += p->nNodes[i];
    // allocate memory for the nodes of each class
    p->pNodesMem = ABC_ALLOC( int, p->nNodesTotal );
    p->pNodes0Mem = ABC_ALLOC( int, p->nNodesTotal );
    p->nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
        p->pNodes[i] = p->pNodesMem + p->nNodesTotal;
        p->pNodes0[i] = p->pNodes0Mem + p->nNodesTotal;
        p->nNodesTotal += p->nNodes[i];
        p->nNodes[i] = 0;
    }
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // add the nodes to storage
    nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
         for ( k = 0; k < p->nSubgr[i]; k++ )
            Dar_LibSetup_rec( p, Dar_LibObj(p, p->pSubgr[i][k]), i, 1 );
         nNodesTotal += p->nNodes[i];
//printf( "Class %3d : Subgraphs = %4d. Nodes = %5d.\n", i, p->nSubgr[i], p->nNodes[i] );
    }
    assert( nNodesTotal == p->nNodesTotal );
     // prepare the number of the PI nodes
    for ( i = 0; i < 4; i++ )
        Dar_LibObj(p, i)->Num = i;
}